

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-base.h
# Opt level: O2

string * __thiscall
mp::BasicSolver::GetSolutionStub_abi_cxx11_
          (string *__return_storage_ptr__,BasicSolver *this,SolverOption *param_1)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->solution_stub_);
  return __return_storage_ptr__;
}

Assistant:

std::string GetSolutionStub(const SolverOption &) const {
    return solution_stub_;
  }